

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O0

int evmap_signal_foreach_event_fn(event_base *base,int signum,evmap_signal *sig_info,void *arg)

{
  int iVar1;
  int r;
  evmap_foreach_event_helper *h;
  event *ev;
  void *arg_local;
  evmap_signal *sig_info_local;
  int signum_local;
  event_base *base_local;
  
  h = (evmap_foreach_event_helper *)(sig_info->events).lh_first;
  while( true ) {
    if (h == (evmap_foreach_event_helper *)0x0) {
      return 0;
    }
    iVar1 = (**arg)(base,h,*(undefined8 *)((long)arg + 8));
    if (iVar1 != 0) break;
    h = (evmap_foreach_event_helper *)h[4].arg;
  }
  return iVar1;
}

Assistant:

static int
evmap_signal_foreach_event_fn(struct event_base *base, int signum,
    struct evmap_signal *sig_info, void *arg)
{
	struct event *ev;
	struct evmap_foreach_event_helper *h = arg;
	int r;
	LIST_FOREACH(ev, &sig_info->events, ev_signal_next) {
		if ((r = h->fn(base, ev, h->arg)))
			return r;
	}
	return 0;
}